

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix3f.cpp
# Opt level: O2

Vector3f operator*(Matrix3f *m,Vector3f *v)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  float *pfVar4;
  Vector3f *in_RDX;
  float *pfVar5;
  int i;
  long lVar6;
  int j;
  long lVar7;
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  Vector3f VVar10;
  
  auVar8 = ZEXT1664(ZEXT816(0) << 0x40);
  auVar9 = ZEXT1664(ZEXT816(0) << 0x40);
  Vector3f::Vector3f((Vector3f *)m,0.0,0.0,0.0);
  for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
    lVar7 = 0;
    pfVar5 = v->m_elements;
    while (lVar7 != 3) {
      fVar1 = *pfVar5;
      pfVar4 = Vector3f::operator[](in_RDX,(int)lVar7);
      fVar2 = *pfVar4;
      pfVar4 = Vector3f::operator[]((Vector3f *)m,(int)lVar6);
      auVar8 = ZEXT464((uint)fVar1);
      lVar7 = lVar7 + 1;
      pfVar5 = pfVar5 + 3;
      auVar3 = vfmadd213ss_fma(ZEXT416((uint)fVar2),ZEXT416((uint)fVar1),ZEXT416((uint)*pfVar4));
      auVar9 = ZEXT1664(auVar3);
      *pfVar4 = auVar3._0_4_;
    }
    v = (Vector3f *)((long)v + 4);
  }
  VVar10.m_elements._0_8_ = auVar8._0_8_;
  VVar10.m_elements[2] = auVar9._0_4_;
  return (Vector3f)VVar10.m_elements;
}

Assistant:

Vector3f operator * ( const Matrix3f& m, const Vector3f& v )
{
	Vector3f output( 0, 0, 0 );

	for( int i = 0; i < 3; ++i )
	{
		for( int j = 0; j < 3; ++j )
		{
			output[ i ] += m( i, j ) * v[ j ];
		}
	}

	return output;
}